

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

int ndiSerialProbe(char *device,bool checkDSR)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int errorCode;
  char init_reply [16];
  char reply [1024];
  
  iVar1 = ndiSerialOpen(device);
  if (iVar1 == -1) {
    return 0x101;
  }
  if ((checkDSR) && (iVar2 = ndiSerialCheckDSR(iVar1), iVar2 == 0)) {
    ndiSerialClose(iVar1);
    return 0x200;
  }
  iVar2 = ndiSerialComm(iVar1,0x2580,"8N1",0);
  if ((iVar2 < 0) || (iVar2 = ndiSerialTimeout(iVar1,100), iVar2 < 0)) {
LAB_00105e72:
    ndiSerialClose(iVar1);
    iVar1 = 0x102;
  }
  else {
    ndiSerialFlush(iVar1,3);
    iVar2 = ndiSerialWrite(iVar1,"INIT:E3A5\r",10);
    if ((iVar2 < 10) ||
       (((iVar2 = ndiSerialSleep(iVar1,100), iVar2 < 0 ||
         (iVar2 = ndiSerialRead(iVar1,init_reply,0x10,false,&errorCode), iVar2 < 1)) ||
        (iVar2 = bcmp(init_reply,"OKAYA896\r",9), iVar2 != 0)))) {
      ndiSerialTimeout(iVar1,7000);
      ndiSerialFlush(iVar1,3);
      iVar2 = ndiSerialFlush(iVar1,3);
      if ((iVar2 < 0) || (iVar2 = ndiSerialBreak(iVar1), iVar2 != 0)) goto LAB_00105e72;
      iVar2 = ndiSerialRead(iVar1,init_reply,0x10,false,&errorCode);
      if (iVar2 < 0) goto LAB_00105fda;
      if (iVar2 != 0) {
        iVar2 = bcmp(init_reply,"RESETBE6F\r",10);
        if (iVar2 != 0) goto LAB_00105ed9;
        ndiSerialSleep(iVar1,100);
        uVar3 = ndiSerialWrite(iVar1,"INIT:E3A5\r",10);
        if ((int)uVar3 < 0) {
          ndiSerialClose(iVar1);
          return 0x104;
        }
        if (9 < uVar3) {
          ndiSerialSleep(iVar1,100);
          iVar2 = ndiSerialRead(iVar1,init_reply,0x10,false,&errorCode);
          if (iVar2 < 0) {
            ndiSerialClose(iVar1);
            return 0x105;
          }
          if (iVar2 != 0) {
            iVar2 = bcmp(init_reply,"OKAYA896\r",9);
            if (iVar2 != 0) {
              ndiSerialClose(iVar1);
              return 0x107;
            }
            goto LAB_00105f6a;
          }
        }
      }
    }
    else {
LAB_00105f6a:
      ndiSerialSleep(iVar1,100);
      iVar2 = ndiSerialWrite(iVar1,"GETINFO:Features.Firmware.Version0492\r",0x26);
      if (iVar2 != 0x26) {
        ndiSerialClose(iVar1);
        return 0x202;
      }
      iVar2 = ndiSerialRead(iVar1,reply,0x3ff,false,&errorCode);
      if (iVar2 != 0) {
        if (-1 < iVar2) {
          iVar2 = bcmp(reply,"ERROR",5);
          if (iVar2 == 0) {
            iVar2 = ndiSerialWrite(iVar1,"VER:065EE\r",10);
            if ((iVar2 < 10) ||
               (iVar2 = ndiSerialRead(iVar1,reply,0x3ff,false,&errorCode), iVar2 < 7)) {
              ndiSerialClose(iVar1);
              return 0x203;
            }
          }
          else if (reply._0_8_ != 0x7365727574616546) {
LAB_00105ed9:
            ndiSerialClose(iVar1);
            return 0x201;
          }
          ndiSerialClose(iVar1);
          return 0;
        }
LAB_00105fda:
        ndiSerialClose(iVar1);
        return errorCode;
      }
    }
    ndiSerialClose(iVar1);
    iVar1 = 0x103;
  }
  return iVar1;
}

Assistant:

ndicapiExport int ndiSerialProbe(const char* device, bool checkDSR)
{
  char reply[1024];
  char init_reply[16];
  NDIFileHandle serial_port;
  int n;

  serial_port = ndiSerialOpen(device);
  if (serial_port == NDI_INVALID_HANDLE)
  {
    return NDI_OPEN_ERROR;
  }

  // check DSR line to see whether any device is connected
  if (checkDSR && !ndiSerialCheckDSR(serial_port))
  {
    ndiSerialClose(serial_port);
    return NDI_DSR_FAILURE;
  }

  // set comm parameters to default, but decrease timeout to 0.1s
  if (ndiSerialComm(serial_port, 9600, "8N1", 0) < 0 || ndiSerialTimeout(serial_port, 100) < 0)
  {
    ndiSerialClose(serial_port);
    return NDI_BAD_COMM;
  }

  // flush the buffers (which are unlikely to contain anything)
  ndiSerialFlush(serial_port, NDI_IOFLUSH);

  // try to initialize ndicapi
  int errorCode;
  if (ndiSerialWrite(serial_port, "INIT:E3A5\r", 10) < 10 || ndiSerialSleep(serial_port, 100) < 0 ||
      ndiSerialRead(serial_port, init_reply, 16, false, &errorCode) <= 0 || strncmp(init_reply, "OKAYA896\r", 9) != 0)
  {
    // increase timeout to 7 seconds for reset
    ndiSerialTimeout(serial_port, 7000);

    // init failed: flush, reset, and try again
    ndiSerialFlush(serial_port, NDI_IOFLUSH);
    if (ndiSerialFlush(serial_port, NDI_IOFLUSH) < 0 ||
        ndiSerialBreak(serial_port))
    {
      ndiSerialClose(serial_port);
      return NDI_BAD_COMM;
    }

    n = ndiSerialRead(serial_port, init_reply, 16, false, &errorCode);
    if (n < 0)
    {
      ndiSerialClose(serial_port);
      return errorCode;
    }
    else if (n == 0)
    {
      ndiSerialClose(serial_port);
      return NDI_TIMEOUT;
    }

    // check reply from reset
    if (strncmp(init_reply, "RESETBE6F\r", 10) != 0)
    {
      ndiSerialClose(serial_port);
      return NDI_BAD_REPLY;
    }
    // try to initialize a second time
    ndiSerialSleep(serial_port, 100);
    n = ndiSerialWrite(serial_port, "INIT:E3A5\r", 10);
    if (n < 0)
    {
      ndiSerialClose(serial_port);
      return NDI_WRITE_ERROR;
    }
    else if (n < 10)
    {
      ndiSerialClose(serial_port);
      return NDI_TIMEOUT;
    }

    ndiSerialSleep(serial_port, 100);
    n = ndiSerialRead(serial_port, init_reply, 16, false, &errorCode);
    if (n < 0)
    {
      ndiSerialClose(serial_port);
      return NDI_READ_ERROR;
    }
    else if (n == 0)
    {
      ndiSerialClose(serial_port);
      return NDI_TIMEOUT;
    }

    if (strncmp(init_reply, "OKAYA896\r", 9) != 0)
    {
      ndiSerialClose(serial_port);
      return NDI_PROBE_FAIL;
    }
  }

  ndiSerialSleep(serial_port, 100);
  if (ndiSerialWrite(serial_port, "GETINFO:Features.Firmware.Version0492\r", strlen("GETINFO:Features.Firmware.Version0492\r")) != strlen("GETINFO:Features.Firmware.Version0492\r"))
  {
    ndiSerialClose(serial_port);
    return NDI_NO_FEATURES_FIRMWARE;
  }

  n = ndiSerialRead(serial_port, reply, 1023, false, &errorCode);
  if (n == 0)
  {
    ndiSerialClose(serial_port);
    return NDI_TIMEOUT;
  }
  else if (n < 0)
  {
    ndiSerialClose(serial_port);
    return errorCode;
  }
  else
  {
    if (strncmp(reply, "ERROR", 5) == 0)
    {
      if (ndiSerialWrite(serial_port, "VER:065EE\r", 10) < 10 ||
          (n = ndiSerialRead(serial_port, reply, 1023, false, &errorCode)) < 7)
      {
        ndiSerialClose(serial_port);
        return NDI_COMMAND_VER_FAILED;
      }
    }
    else if (strncmp(reply, "Features", strlen("Features")) != 0)
    {
      ndiSerialClose(serial_port);
      return NDI_BAD_REPLY;
    }
  }

  // restore things back to the way they were
  ndiSerialClose(serial_port);

  return NDI_OKAY;
}